

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

lysc_node_notif * lysc_node_notifs(lysc_node *node)

{
  lysc_node_notif **pplVar1;
  lysc_node_notif **notifs;
  lysc_node *node_local;
  
  pplVar1 = lysc_node_notifs_p(node);
  if (pplVar1 == (lysc_node_notif **)0x0) {
    node_local = (lysc_node *)0x0;
  }
  else {
    node_local = (lysc_node *)*pplVar1;
  }
  return (lysc_node_notif *)node_local;
}

Assistant:

lysc_node_notif *
lysc_node_notifs(const struct lysc_node *node)
{
    struct lysc_node_notif **notifs;

    notifs = lysc_node_notifs_p((struct lysc_node *)node);
    if (notifs) {
        return *notifs;
    } else {
        return NULL;
    }
}